

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O2

void printopaquemem(MCInst *MI,uint OpNo,SStream *O)

{
  cs_mode cVar1;
  
  SStream_concat0(O,"ptr ");
  cVar1 = MI->csh->mode;
  if (cVar1 == CS_MODE_64) {
    if ((MI->flat_insn->id & 0xfffffffe) == 0x9c) {
      MI->x86opsize = '\n';
    }
    else {
      MI->x86opsize = '\b';
    }
    goto LAB_001a2616;
  }
  if (cVar1 == CS_MODE_32) {
    if ((MI->flat_insn->id & 0xfffffffe) == 0x9c) {
      MI->x86opsize = '\x06';
      goto LAB_001a2616;
    }
  }
  else {
    if (cVar1 != CS_MODE_16) goto LAB_001a2616;
    if ((MI->flat_insn->id & 0xfffffffe) != 0x9c) {
      MI->x86opsize = '\x02';
      goto LAB_001a2616;
    }
  }
  MI->x86opsize = '\x04';
LAB_001a2616:
  printMemReference(MI,OpNo,O);
  return;
}

Assistant:

static void printopaquemem(MCInst *MI, unsigned OpNo, SStream *O)
{
	switch(MI->csh->mode) {
		case CS_MODE_16:
			MI->x86opsize = 2;
			break;
		case CS_MODE_32:
			MI->x86opsize = 4;
			break;
		case CS_MODE_64:
			MI->x86opsize = 8;
			break;
		default:	// never reach
			break;
	}

	printMemReference(MI, OpNo, O);
}